

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Value __thiscall Catch::RunContext::actOnCurrentResult(RunContext *this,AssertionResult *result)

{
  bool bVar1;
  ulong uVar2;
  RunContext *in_RDI;
  Value action;
  AssertionResult *in_stack_ffffffffffffffd8;
  Value local_14;
  
  AssertionResult::operator=((AssertionResult *)in_RDI,in_stack_ffffffffffffffd8);
  (**(code **)(*(long *)&in_RDI->super_IResultCapture + 0x10))(in_RDI,&in_RDI->m_lastResult);
  local_14 = None;
  bVar1 = AssertionResult::isOk((AssertionResult *)in_RDI);
  if (!bVar1) {
    local_14 = Failed;
    uVar2 = (**(code **)(*(long *)&in_RDI->super_IResultCapture + 0x38))();
    if ((uVar2 & 1) != 0) {
      local_14 = Debug|Failed;
    }
    bVar1 = aborting(in_RDI);
    if (bVar1) {
      local_14 = local_14 | Abort;
    }
  }
  return local_14;
}

Assistant:

ResultAction::Value actOnCurrentResult( AssertionResult const& result ) {
            m_lastResult = result;
            assertionEnded( m_lastResult );

            ResultAction::Value action = ResultAction::None;

            if( !m_lastResult.isOk() ) {
                action = ResultAction::Failed;
                if( shouldDebugBreak() )
                    action = (ResultAction::Value)( action | ResultAction::Debug );
                if( aborting() )
                    action = (ResultAction::Value)( action | ResultAction::Abort );
            }
            return action;
        }